

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmd5stream.cpp
# Opt level: O0

int __thiscall TPZMD5Stream::WriteMD5(TPZMD5Stream *this,FILE *fh)

{
  ostream *this_00;
  
  this_00 = std::operator<<((ostream *)&std::cerr,
                            "Enable -DUSING_OPENSSL to use the TPZMD5Stream class.");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return 1;
}

Assistant:

int TPZMD5Stream::WriteMD5(FILE *fh) {
#ifdef USING_OPENSSL
  unsigned char digest[MD5_DIGEST_LENGTH];

  if (last_status != 1)
    return -3;

  if (MD5_Final(digest, md5_sig.operator->()) != 1) {
    return -1;
  }

  if (fwrite((const void *) digest, sizeof(unsigned char), MD5_DIGEST_LENGTH, fh) < MD5_DIGEST_LENGTH)
    return 2;

  return 0; // Return OK
#else
  std::cerr << "Enable -DUSING_OPENSSL to use the TPZMD5Stream class." << std::endl;
  return 1;
#endif
}